

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::f_slash(Forth *this)

{
  double dVar1;
  double dVar2;
  FCell n1;
  FCell n2;
  Forth *this_local;
  
  requireFStackDepth(this,2,"F/");
  dVar1 = ForthStack<double>::getTop(&this->fStack);
  ForthStack<double>::pop(&this->fStack);
  dVar2 = ForthStack<double>::getTop(&this->fStack);
  ForthStack<double>::setTop(&this->fStack,dVar2 / dVar1);
  return;
}

Assistant:

void f_slash() {
			REQUIRE_FSTACK_DEPTH(2, "F/");
			auto n2 = static_cast<FCell>(fStack.getTop()); fStack.pop();
			auto n1 = static_cast<FCell>(fStack.getTop());
			// division by 0 must return actual Nan +Inf or -Inf
			// RUNTIME_ERROR_IF(n2 == 0., "/: zero divisor", errorDivisionByZero);
			fStack.setTop(static_cast<FCell>(n1 / n2));
		}